

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

problem * baryonyx::unpreprocess(problem *__return_storage_ptr__,context *ctx,raw_problem *raw_pb)

{
  size_t size;
  tuple<double,_baryonyx::show_size_type> *mem;
  baryonyx local_50 [16];
  string local_40;
  raw_problem *local_20;
  raw_problem *raw_pb_local;
  context *ctx_local;
  
  local_20 = raw_pb;
  raw_pb_local = (raw_problem *)ctx;
  ctx_local = (context *)__return_storage_ptr__;
  size = memory_consumed(raw_pb);
  memory_consumed_size<unsigned_long>(local_50,size);
  to_string_abi_cxx11_(&local_40,local_50,mem);
  info<std::__cxx11::string>(ctx,"- Unprepossessing starts (size: {})\n",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  problem::problem(__return_storage_ptr__,local_20);
  return __return_storage_ptr__;
}

Assistant:

problem
unpreprocess(const context& ctx, const raw_problem& raw_pb)
{
    info(ctx,
         "- Unprepossessing starts (size: {})\n",
         to_string(memory_consumed_size(memory_consumed(raw_pb))));

    return problem(raw_pb);
}